

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.h
# Opt level: O3

string * __thiscall
wallet::CWallet::GetDisplayName_abi_cxx11_(string *__return_storage_ptr__,CWallet *this)

{
  size_type sVar1;
  pointer pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  long in_FS_OFFSET;
  string wallet_name;
  long *local_30 [2];
  long local_20 [2];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  sVar1 = (this->m_name)._M_string_length;
  local_30[0] = local_20;
  if (sVar1 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_30,"default wallet","");
  }
  else {
    pcVar2 = (this->m_name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)local_30,pcVar2,pcVar2 + sVar1);
  }
  tinyformat::format<std::__cxx11::string>
            (__return_storage_ptr__,(tinyformat *)0x4a4f97,(char *)local_30,in_RCX);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string GetDisplayName() const override
    {
        std::string wallet_name = GetName().length() == 0 ? "default wallet" : GetName();
        return strprintf("[%s]", wallet_name);
    }